

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::V_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<(anonymous_namespace)::V_const&> *this,
          int *rhs)

{
  int iVar1;
  int iVar2;
  V *value;
  ostream *poVar3;
  int *value_00;
  ostringstream os;
  ulong *local_2b0;
  ulong local_2a0;
  undefined8 uStack_298;
  long *local_290;
  long local_288;
  long local_280;
  undefined8 uStack_278;
  long *local_270;
  long local_268;
  undefined1 local_260;
  undefined7 uStack_25f;
  undefined8 uStack_258;
  ulong *local_250;
  size_type local_248;
  ulong local_240;
  undefined4 uStack_238;
  undefined4 uStack_234;
  ulong *local_230;
  size_type local_228;
  ulong local_220;
  undefined8 uStack_218;
  string local_210;
  bool local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  value = *(V **)this;
  iVar2 = value->value;
  iVar1 = *rhs;
  local_270 = (long *)&local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"==","");
  local_290 = &local_280;
  if (local_270 == (long *)&local_260) {
    uStack_278 = uStack_258;
  }
  else {
    local_290 = local_270;
  }
  local_280 = CONCAT71(uStack_25f,local_260);
  local_288 = local_268;
  local_268 = 0;
  local_260 = 0;
  local_270 = (long *)&local_260;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  to_string<(anonymous_namespace)::V>(&local_1c8,value);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_290,local_288);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  string_maker<int>::to_string_abi_cxx11_(&local_210,(string_maker<int> *)rhs,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p == &local_210.field_2) {
    uStack_218 = local_210.field_2._8_8_;
    local_230 = &local_220;
  }
  else {
    local_230 = (ulong *)local_210._M_dataplus._M_p;
  }
  local_220 = local_210.field_2._M_allocated_capacity;
  local_228 = local_210._M_string_length;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(char *)local_230,local_210._M_string_length);
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p == &local_210.field_2) {
    uStack_298 = local_210.field_2._8_8_;
    local_2b0 = &local_2a0;
  }
  else {
    local_2b0 = (ulong *)local_210._M_dataplus._M_p;
  }
  local_2a0 = local_210.field_2._M_allocated_capacity;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_2b0 == &local_2a0) {
    uStack_238 = (undefined4)uStack_298;
    uStack_234 = uStack_298._4_4_;
    local_250 = &local_240;
  }
  else {
    local_250 = local_2b0;
  }
  local_240 = local_2a0;
  local_248 = local_210._M_string_length;
  local_2a0 = local_2a0 & 0xffffffffffffff00;
  local_1f0 = iVar2 == iVar1;
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_250,(long)local_250 + local_210._M_string_length);
  __return_storage_ptr__->passed = local_1f0;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_1e8,local_1e0 + (long)local_1e8)
  ;
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if (local_270 != (long *)&local_260) {
    operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator!=( R const & rhs ) { return result( lhs != rhs, to_string( lhs, "!=", rhs ) ); }